

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::core::extractCoreType_abi_cxx11_(int argc,char **argv)

{
  bool bVar1;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  char ***in_stack_00000020;
  int *in_stack_00000028;
  helicsCLI11App *in_stack_00000030;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  string namestring;
  string corestring;
  string *in_stack_00000350;
  string *in_stack_00000358;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [2];
  
  this = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  this_00 = local_58;
  std::__cxx11::string::string(this_00);
  anon_unknown_5::makeCLITypeApp(in_stack_00000358,in_stack_00000350);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x6765f8);
  helicsCLI11App::helics_parse<int&,char**&>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x67661a);
  if (bVar1) {
    CLI::std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (this,&in_RDI->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x67663b);
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    coreTypeFromString((string_view)namestring.field_2);
    CLI::std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (this,&in_RDI->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6766ae);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return this;
}

Assistant:

std::pair<CoreType, std::string> extractCoreType(int argc, char* argv[])
{
    std::string corestring;
    std::string namestring;
    auto app = makeCLITypeApp(corestring, namestring);
    app->helics_parse(argc, argv);
    if (corestring.empty()) {
        return {CoreType::DEFAULT, namestring};
    }
    return {coreTypeFromString(corestring), namestring};
}